

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test::TestBody
          (ZLIBBufferCompressorTest_test_different_size_buffers_buffer_Test *this)

{
  ulong uVar1;
  byte local_c9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  for (uVar1 = 0; uVar1 != 0x100; uVar1 = uVar1 + 1) {
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (local_c9 = 0; local_c9 < uVar1; local_c9 = local_c9 + 1) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&buffer,&local_c9);
    }
    ZLIBBufferCompressorTest::TestCompression
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
               &this->super_ZLIBBufferCompressorTest,&buffer,0x10000);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
    ZLIBBufferCompressorTest::TestCompression
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
               &this->super_ZLIBBufferCompressorTest,&buffer,8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
    ZLIBBufferCompressorTest::TestCompression
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
               &this->super_ZLIBBufferCompressorTest,&buffer,0x10000);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
    ZLIBBufferCompressorTest::TestCompression
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
               &this->super_ZLIBBufferCompressorTest,&buffer,0x10000);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    ZLIBBufferCompressorTest::TestCompression
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
               &this->super_ZLIBBufferCompressorTest,&buffer,0x10000);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&buffer);
  }
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_different_size_buffers_buffer)
{
    for (size_t i = 0; i < 256; i++)
    {
        std::vector<unsigned char> buffer;
        for (unsigned char j = 0; j < i; j++)
        {
            buffer.emplace_back(j);
        }
        TestCompression(buffer, 65536);
        TestCompression(buffer, 8);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
        TestCompression(buffer, 65536);
    }
}